

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

void CVmObjList::join(vm_val_t *retval,vm_val_t *self_val,char *sep,size_t sep_len)

{
  CVmObjPageEntry *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ushort *puVar7;
  long lVar8;
  size_t len;
  int iVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  vm_val_t ele;
  vm_val_t tmp_str;
  char buf [128];
  
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&self_val->field_0x4;
  aVar1 = self_val->val;
  sp_ = sp_ + 1;
  pvVar3->typ = self_val->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  iVar5 = vm_val_t::ll_length(self_val);
  lVar11 = 0;
  iVar9 = 0;
  if (0 < iVar5) {
    iVar9 = iVar5;
  }
  for (iVar12 = 1; -iVar9 + iVar12 != 1; iVar12 = iVar12 + 1) {
    vm_val_t::ll_index(self_val,&ele,iVar12);
    puVar7 = (ushort *)vm_val_t::get_as_string(&ele);
    if (puVar7 == (ushort *)0x0) {
      if (ele.typ == VM_OBJ) {
        lVar11 = lVar11 + 0x80;
      }
      else if (ele.typ == VM_INT) {
        lVar11 = lVar11 + 10;
      }
    }
    else {
      lVar11 = lVar11 + (ulong)*puVar7;
    }
  }
  lVar8 = (iVar5 - 1) * sep_len;
  if (iVar5 < 1) {
    lVar8 = 0;
  }
  vVar6 = CVmObjString::create(0,lVar11 + lVar8);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar6;
  pvVar3 = sp_;
  this = G_obj_table_X.pages_[vVar6 >> 0xc] + (vVar6 & 0xfff);
  pcVar10 = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8) +
                    2);
  uVar2 = *(undefined4 *)&retval->field_0x4;
  aVar1 = retval->val;
  sp_ = sp_ + 1;
  pvVar3->typ = retval->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  iVar12 = 1;
  do {
    if (-iVar9 + iVar12 == 1) {
      CVmObjString::cons_shrink_buffer((CVmObjString *)this,pcVar10);
      sp_ = sp_ + -2;
      return;
    }
    vm_val_t::ll_index(self_val,&ele,iVar12);
    tmp_str.typ = VM_NIL;
    puVar7 = (ushort *)vm_val_t::get_as_string(&ele);
    if (puVar7 == (ushort *)0x0) {
      if (ele.typ == VM_NIL) {
        puVar7 = (ushort *)0x2a7c85;
        len = 0;
      }
      else {
        if (ele.typ != VM_INT) {
          puVar7 = (ushort *)vm_val_t::cast_to_string(&ele,&tmp_str);
          if (puVar7 == (ushort *)0x0) {
            err_throw(0x900);
          }
          goto LAB_002633e6;
        }
        puVar7 = (ushort *)buf;
        sprintf((char *)puVar7,"%ld",(long)ele.val.intval);
        len = strlen((char *)puVar7);
      }
    }
    else {
LAB_002633e6:
      len = (size_t)*puVar7;
      puVar7 = puVar7 + 1;
    }
    pvVar3 = sp_;
    pvVar4 = sp_ + 1;
    *(ulong *)sp_ = CONCAT44(tmp_str._4_4_,tmp_str.typ);
    sp_ = pvVar4;
    pvVar3->val = tmp_str.val;
    pcVar10 = CVmObjString::cons_ensure_space((CVmObjString *)this,pcVar10,len,0x100);
    memcpy(pcVar10,puVar7,len);
    pcVar10 = pcVar10 + len;
    if (iVar12 < iVar5 && sep_len != 0) {
      pcVar10 = CVmObjString::cons_ensure_space((CVmObjString *)this,pcVar10,sep_len,0x20);
      memcpy(pcVar10,sep,sep_len);
      pcVar10 = pcVar10 + sep_len;
    }
    sp_ = sp_ + -1;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void CVmObjList::join(VMG_ vm_val_t *retval,
                      const vm_val_t *self_val,
                      const char *sep, size_t sep_len)
{
    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Do a first pass through the list to measure the size we'll need.
     *   For string elements we'll know exactly what we need; for
     *   non-strings, make a guess, and we'll expand the buffer later if
     *   needed.  
     */
    vm_val_t ele;
    size_t alo_len = 0;
    int i, lst_len = self_val->ll_length(vmg0_);
    for (i = 1 ; i <= lst_len ; ++i)
    {
        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* if it's a string, get its length; for other types, make a guess */
        const char *es = ele.get_as_string(vmg0_);
        if (es != 0)
        {
            /* it's a string - add its length to the running total */
            alo_len += vmb_get_len(es);
        }
        else
        {
            /* for other types, guess based on the type */
            switch (ele.typ)
            {
            case VM_INT:
                /* integers - leave room for 10 characters */
                alo_len += 10;
                break;

            case VM_OBJ:
                /* 
                 *   object conversion could take almost any amount of space;
                 *   make a wild guess for now 
                 */
                alo_len += 128;
                break;

            default:
                /* assume nothing for other types */
                break;
            }
        }
    }

    /* add in the space needed for the separators */
    if (lst_len > 0)
        alo_len += sep_len * (lst_len - 1);

    /* create a string with the allocated size */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, alo_len));
    CVmObjString *strp = (CVmObjString *)vm_objp(vmg_ retval->val.obj);

    /* get a write pointer to the buffer */
    char *dst = strp->cons_get_buf();

    /* push it for gc protection */
    G_stk->push(retval);

    /* build the string */
    for (i = 1 ; i <= lst_len ; ++i)
    {
        char buf[128];
        vm_val_t tmp_str;

        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* assume we won't need a temporary string */
        tmp_str.set_nil();

        /* try getting it as a string directly */
        const char *es = ele.get_as_string(vmg0_);
        size_t es_len;
        if (es != 0)
        {
            /* it's a string - get its length and buffer */
            es_len = vmb_get_len(es);
            es += VMB_LEN;
        }
        else
        {
            /* for other types, do the implied string conversion */
            switch (ele.typ)
            {
            case VM_INT:
                /* integer - format in decimal */
                sprintf(buf, "%ld", (long)ele.val.intval);
                es = buf;
                es_len = strlen(es);
                break;

            case VM_NIL:
                /* nil - use an empty string */
                es = "";
                es_len = 0;
                break;

            default:
                /* for anything else, see what casting comes up with */
                if ((es = ele.cast_to_string(vmg_ &tmp_str)) == 0)
                    err_throw(VMERR_BAD_TYPE_BIF);

                /* get the length and buffer */
                es_len = vmb_get_len(es);
                es += VMB_LEN;
                break;
            }
        }

        /* push the temp string (if any) for gc protection */
        G_stk->push(&tmp_str);

        /* append the current string, making sure we have enough space */
        dst = strp->cons_ensure_space(vmg_ dst, es_len, 256);
        memcpy(dst, es, es_len);
        dst += es_len;

        /* if there's another element, append the separator */
        if (i < lst_len && sep_len != 0)
        {
            dst = strp->cons_ensure_space(vmg_ dst, sep_len, 32);
            memcpy(dst, sep, sep_len);
            dst += sep_len;
        }

        /* discard the temp string */
        G_stk->discard(1);
    }

    /* set the string to its final length */
    strp->cons_shrink_buffer(vmg_ dst);

    /* remove gc protection */
    G_stk->discard(2);
}